

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PDFDocumentHandler.cpp
# Opt level: O3

void __thiscall
PDFDocumentHandler::RegisterResourcesForResourcesCategory
          (PDFDocumentHandler *this,PDFFormXObject *inTargetFormXObject,
          ICategoryServicesCommand *inCommand,PDFDictionary *inResourcesDictionary,
          ObjectIDTypeList *ioObjectsToLaterCopy,StringToStringMap *ioMappedResourcesNames)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  PDFParser *this_00;
  _Base_ptr p_Var2;
  _Base_ptr p_Var3;
  DocumentContext *this_01;
  iteratorType iVar4;
  PDFDocumentHandler *pPVar5;
  EPDFObjectType EVar6;
  PDFObject *inOriginal;
  IndirectObjectsReferenceRegistry *this_02;
  ObjectIDType OVar7;
  _List_node_base *p_Var8;
  string *psVar9;
  ResourceCopierTask *this_03;
  _Rb_tree_header *p_Var10;
  _Base_ptr p_Var11;
  PDFDocumentHandler *this_04;
  PDFFormXObject *this_05;
  MapIterator<std::map<PDFName_*,_PDFObject_*,_PDFNameLess,_std::allocator<std::pair<PDFName_*const,_PDFObject_*>_>_>_>
  it;
  PDFObjectCastPtr<PDFDictionary> resourcesCategoryDictionary;
  undefined1 local_120 [32];
  string local_100;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_e0;
  MapIterator<std::map<PDFName_*,_PDFObject_*,_PDFNameLess,_std::allocator<std::pair<PDFName_*const,_PDFObject_*>_>_>_>
  local_a0;
  _Rb_tree_header *local_88;
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
  *local_80;
  PDFFormXObject *local_78;
  RefCountPtr<PDFDictionary> local_70;
  _Rb_tree<unsigned_long,std::pair<unsigned_long_const,unsigned_long>,std::_Select1st<std::pair<unsigned_long_const,unsigned_long>>,std::less<unsigned_long>,std::allocator<std::pair<unsigned_long_const,unsigned_long>>>
  *local_60;
  PDFDocumentHandler *local_58;
  string local_50;
  
  this_00 = this->mParser;
  local_80 = (_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
              *)ioMappedResourcesNames;
  local_78 = inTargetFormXObject;
  local_58 = (PDFDocumentHandler *)ioObjectsToLaterCopy;
  (*inCommand->_vptr_ICategoryServicesCommand[2])(&local_e0,inCommand);
  inOriginal = PDFParser::QueryDictionaryObject(this_00,inResourcesDictionary,&local_e0.first);
  local_70.mValue = PDFObjectCast<PDFDictionary>(inOriginal);
  local_70._vptr_RefCountPtr = (_func_int **)&PTR__RefCountPtr_003a58a0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e0.first._M_dataplus._M_p != &local_e0.first.field_2) {
    operator_delete(local_e0.first._M_dataplus._M_p,local_e0.first.field_2._M_allocated_capacity + 1
                   );
  }
  if ((local_70.mValue != (PDFDictionary *)0x0) &&
     (PDFDictionary::GetIterator(&local_a0,local_70.mValue),
     local_a0.
     super_ContainerIterator<std::map<PDFName_*,_PDFObject_*,_PDFNameLess,_std::allocator<std::pair<PDFName_*const,_PDFObject_*>_>_>_>
     .mCurrentPosition._M_node !=
     local_a0.
     super_ContainerIterator<std::map<PDFName_*,_PDFObject_*,_PDFNameLess,_std::allocator<std::pair<PDFName_*const,_PDFObject_*>_>_>_>
     .mEndPosition._M_node)) {
    paVar1 = &local_100.field_2;
    local_60 = (_Rb_tree<unsigned_long,std::pair<unsigned_long_const,unsigned_long>,std::_Select1st<std::pair<unsigned_long_const,unsigned_long>>,std::less<unsigned_long>,std::allocator<std::pair<unsigned_long_const,unsigned_long>>>
                *)&this->mSourceToTarget;
    local_88 = &(this->mSourceToTarget)._M_t._M_impl.super__Rb_tree_header;
    do {
      iVar4._M_node =
           local_a0.
           super_ContainerIterator<std::map<PDFName_*,_PDFObject_*,_PDFNameLess,_std::allocator<std::pair<PDFName_*const,_PDFObject_*>_>_>_>
           .mEndPosition._M_node;
      if (local_a0.
          super_ContainerIterator<std::map<PDFName_*,_PDFObject_*,_PDFNameLess,_std::allocator<std::pair<PDFName_*const,_PDFObject_*>_>_>_>
          .mFirstMove == true) {
        local_a0.
        super_ContainerIterator<std::map<PDFName_*,_PDFObject_*,_PDFNameLess,_std::allocator<std::pair<PDFName_*const,_PDFObject_*>_>_>_>
        .mFirstMove = false;
      }
      else {
        local_a0.
        super_ContainerIterator<std::map<PDFName_*,_PDFObject_*,_PDFNameLess,_std::allocator<std::pair<PDFName_*const,_PDFObject_*>_>_>_>
        .mCurrentPosition._M_node =
             (_Base_ptr)
             std::_Rb_tree_increment
                       (local_a0.
                        super_ContainerIterator<std::map<PDFName_*,_PDFObject_*,_PDFNameLess,_std::allocator<std::pair<PDFName_*const,_PDFObject_*>_>_>_>
                        .mCurrentPosition._M_node);
        if (local_a0.
            super_ContainerIterator<std::map<PDFName_*,_PDFObject_*,_PDFNameLess,_std::allocator<std::pair<PDFName_*const,_PDFObject_*>_>_>_>
            .mCurrentPosition._M_node == iVar4._M_node) break;
      }
      EVar6 = PDFObject::GetType((PDFObject *)
                                 local_a0.
                                 super_ContainerIterator<std::map<PDFName_*,_PDFObject_*,_PDFNameLess,_std::allocator<std::pair<PDFName_*const,_PDFObject_*>_>_>_>
                                 .mCurrentPosition._M_node[1]._M_parent);
      if (EVar6 == ePDFObjectIndirectObjectReference) {
        p_Var2 = local_a0.
                 super_ContainerIterator<std::map<PDFName_*,_PDFObject_*,_PDFNameLess,_std::allocator<std::pair<PDFName_*const,_PDFObject_*>_>_>_>
                 .mCurrentPosition._M_node[1]._M_parent;
        p_Var11 = (this->mSourceToTarget)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
        if (p_Var11 == (_Base_ptr)0x0) {
LAB_001cbcea:
          this_02 = ObjectsContext::GetInDirectObjectsRegistry(this->mObjectsContext);
          OVar7 = IndirectObjectsReferenceRegistry::AllocateNewObjectID(this_02);
          local_e0.first._M_dataplus._M_p = (pointer)p_Var2[2]._M_parent;
          local_e0.first._M_string_length = OVar7;
          std::
          _Rb_tree<unsigned_long,std::pair<unsigned_long_const,unsigned_long>,std::_Select1st<std::pair<unsigned_long_const,unsigned_long>>,std::less<unsigned_long>,std::allocator<std::pair<unsigned_long_const,unsigned_long>>>
          ::_M_insert_unique<std::pair<unsigned_long_const,unsigned_long>>
                    (local_60,(pair<const_unsigned_long,_unsigned_long> *)&local_e0);
          p_Var8 = (_List_node_base *)operator_new(0x18);
          pPVar5 = local_58;
          p_Var8[1]._M_next = (_List_node_base *)p_Var2[2]._M_parent;
          this_04 = local_58;
          std::__detail::_List_node_base::_M_hook(p_Var8);
          pPVar5->mDocumentContext =
               (DocumentContext *)((long)&pPVar5->mDocumentContext->mObjectsContext + 1);
        }
        else {
          p_Var3 = p_Var2[2]._M_parent;
          p_Var10 = local_88;
          do {
            if (*(_Base_ptr *)(p_Var11 + 1) >= p_Var3) {
              p_Var10 = (_Rb_tree_header *)p_Var11;
            }
            p_Var11 = (&p_Var11->_M_left)[*(_Base_ptr *)(p_Var11 + 1) < p_Var3];
          } while (p_Var11 != (_Base_ptr)0x0);
          if ((p_Var10 == local_88) || (p_Var3 < (_Base_ptr)p_Var10->_M_node_count))
          goto LAB_001cbcea;
          OVar7 = *(ObjectIDType *)(p_Var10 + 1);
          this_04 = (PDFDocumentHandler *)0x0;
        }
        psVar9 = PDFName::GetValue_abi_cxx11_
                           (*(PDFName **)
                             (local_a0.
                              super_ContainerIterator<std::map<PDFName_*,_PDFObject_*,_PDFNameLess,_std::allocator<std::pair<PDFName_*const,_PDFObject_*>_>_>_>
                              .mCurrentPosition._M_node + 1));
        AsEncodedName((string *)local_120,this_04,psVar9);
        (*inCommand->_vptr_ICategoryServicesCommand[3])(&local_100,inCommand,OVar7);
        local_e0.first._M_dataplus._M_p = (pointer)&local_e0.first.field_2;
        if ((_Base_ptr)local_120._0_8_ == (_Base_ptr)(local_120 + 0x10)) {
          local_e0.first.field_2._8_8_ = local_120._24_8_;
        }
        else {
          local_e0.first._M_dataplus._M_p = (pointer)local_120._0_8_;
        }
        local_e0.first.field_2._M_allocated_capacity._1_7_ = local_120._17_7_;
        local_e0.first.field_2._M_local_buf[0] = local_120[0x10];
        local_e0.first._M_string_length = local_120._8_8_;
        local_120._8_8_ = 0;
        local_120[0x10] = '\0';
        local_e0.second._M_dataplus._M_p = (pointer)&local_e0.second.field_2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_100._M_dataplus._M_p == paVar1) {
          local_e0.second.field_2._8_8_ = local_100.field_2._8_8_;
        }
        else {
          local_e0.second._M_dataplus._M_p = local_100._M_dataplus._M_p;
        }
        local_e0.second.field_2._M_allocated_capacity._1_7_ =
             local_100.field_2._M_allocated_capacity._1_7_;
        local_e0.second.field_2._M_local_buf[0] = local_100.field_2._M_local_buf[0];
        local_e0.second._M_string_length = local_100._M_string_length;
        local_100._M_string_length = 0;
        local_100.field_2._M_local_buf[0] = '\0';
        local_120._0_8_ = (_Base_ptr)(local_120 + 0x10);
        local_100._M_dataplus._M_p = (pointer)paVar1;
        std::
        _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
        ::_M_insert_unique<std::pair<std::__cxx11::string_const,std::__cxx11::string>>
                  (local_80,&local_e0);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_e0.second._M_dataplus._M_p != &local_e0.second.field_2) {
          operator_delete(local_e0.second._M_dataplus._M_p,
                          local_e0.second.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_e0.first._M_dataplus._M_p != &local_e0.first.field_2) {
          operator_delete(local_e0.first._M_dataplus._M_p,
                          local_e0.first.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_100._M_dataplus._M_p != paVar1) {
          operator_delete(local_100._M_dataplus._M_p,
                          CONCAT71(local_100.field_2._M_allocated_capacity._1_7_,
                                   local_100.field_2._M_local_buf[0]) + 1);
        }
        if ((_Base_ptr)local_120._0_8_ != (_Base_ptr)(local_120 + 0x10)) {
          operator_delete((void *)local_120._0_8_,CONCAT71(local_120._17_7_,local_120[0x10]) + 1);
        }
      }
      else {
        this_03 = (ResourceCopierTask *)operator_new(0x40);
        this_05 = local_78;
        ResourceCopierTask::ResourceCopierTask
                  (this_03,local_78,this,
                   (PDFObject *)
                   local_a0.
                   super_ContainerIterator<std::map<PDFName_*,_PDFObject_*,_PDFNameLess,_std::allocator<std::pair<PDFName_*const,_PDFObject_*>_>_>_>
                   .mCurrentPosition._M_node[1]._M_parent);
        psVar9 = PDFName::GetValue_abi_cxx11_
                           (*(PDFName **)
                             (local_a0.
                              super_ContainerIterator<std::map<PDFName_*,_PDFObject_*,_PDFNameLess,_std::allocator<std::pair<PDFName_*const,_PDFObject_*>_>_>_>
                              .mCurrentPosition._M_node + 1));
        AsEncodedName((string *)local_120,(PDFDocumentHandler *)this_05,psVar9);
        this_01 = this->mDocumentContext;
        (*inCommand->_vptr_ICategoryServicesCommand[2])(&local_50,inCommand);
        PDFHummus::DocumentContext::AddExtendedResourceMapping
                  (&local_100,this_01,local_78,&local_50,(IResourceWritingTask *)this_03);
        local_e0.first._M_dataplus._M_p = (pointer)&local_e0.first.field_2;
        if ((_Base_ptr)local_120._0_8_ == (_Base_ptr)(local_120 + 0x10)) {
          local_e0.first.field_2._8_8_ = local_120._24_8_;
        }
        else {
          local_e0.first._M_dataplus._M_p = (pointer)local_120._0_8_;
        }
        local_e0.first.field_2._M_allocated_capacity._1_7_ = local_120._17_7_;
        local_e0.first.field_2._M_local_buf[0] = local_120[0x10];
        local_e0.first._M_string_length = local_120._8_8_;
        local_120._8_8_ = 0;
        local_120[0x10] = '\0';
        local_e0.second._M_dataplus._M_p = (pointer)&local_e0.second.field_2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_100._M_dataplus._M_p == paVar1) {
          local_e0.second.field_2._8_8_ = local_100.field_2._8_8_;
        }
        else {
          local_e0.second._M_dataplus._M_p = local_100._M_dataplus._M_p;
        }
        local_e0.second.field_2._M_allocated_capacity._1_7_ =
             local_100.field_2._M_allocated_capacity._1_7_;
        local_e0.second.field_2._M_local_buf[0] = local_100.field_2._M_local_buf[0];
        local_e0.second._M_string_length = local_100._M_string_length;
        local_100._M_string_length = 0;
        local_100.field_2._M_local_buf[0] = '\0';
        local_120._0_8_ = (_Base_ptr)(local_120 + 0x10);
        local_100._M_dataplus._M_p = (pointer)paVar1;
        std::
        _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
        ::_M_insert_unique<std::pair<std::__cxx11::string_const,std::__cxx11::string>>
                  (local_80,&local_e0);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_e0.second._M_dataplus._M_p != &local_e0.second.field_2) {
          operator_delete(local_e0.second._M_dataplus._M_p,
                          local_e0.second.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_e0.first._M_dataplus._M_p != &local_e0.first.field_2) {
          operator_delete(local_e0.first._M_dataplus._M_p,
                          local_e0.first.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_100._M_dataplus._M_p != paVar1) {
          operator_delete(local_100._M_dataplus._M_p,
                          CONCAT71(local_100.field_2._M_allocated_capacity._1_7_,
                                   local_100.field_2._M_local_buf[0]) + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_50._M_dataplus._M_p != &local_50.field_2) {
          operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
        }
        if ((_Base_ptr)local_120._0_8_ != (_Base_ptr)(local_120 + 0x10)) {
          operator_delete((void *)local_120._0_8_,CONCAT71(local_120._17_7_,local_120[0x10]) + 1);
        }
        std::__cxx11::string::_M_assign((string *)&this_03->mResourceName);
      }
    } while (local_a0.
             super_ContainerIterator<std::map<PDFName_*,_PDFObject_*,_PDFNameLess,_std::allocator<std::pair<PDFName_*const,_PDFObject_*>_>_>_>
             .mCurrentPosition._M_node !=
             local_a0.
             super_ContainerIterator<std::map<PDFName_*,_PDFObject_*,_PDFNameLess,_std::allocator<std::pair<PDFName_*const,_PDFObject_*>_>_>_>
             .mEndPosition._M_node);
  }
  RefCountPtr<PDFDictionary>::~RefCountPtr(&local_70);
  return;
}

Assistant:

void PDFDocumentHandler::RegisterResourcesForResourcesCategory(PDFFormXObject* inTargetFormXObject,
                                                               ICategoryServicesCommand* inCommand,
                                                               PDFDictionary* inResourcesDictionary,
                                                               ObjectIDTypeList& ioObjectsToLaterCopy,
                                                               StringToStringMap& ioMappedResourcesNames)
{
    PDFObjectCastPtr<PDFDictionary> resourcesCategoryDictionary(mParser->QueryDictionaryObject(
                                                                                    inResourcesDictionary,inCommand->GetResourcesCategoryName()));
    if(resourcesCategoryDictionary.GetPtr())
    {	
        MapIterator<PDFNameToPDFObjectMap> it(resourcesCategoryDictionary->GetIterator());
        while(it.MoveNext())
        {
            if(it.GetValue()->GetType() == PDFObject::ePDFObjectIndirectObjectReference)
            {
                PDFIndirectObjectReference* indirectReference = (PDFIndirectObjectReference*)(it.GetValue());
                ObjectIDTypeToObjectIDTypeMap::iterator	itObjects = mSourceToTarget.find(indirectReference->mObjectID);
                ObjectIDType targetObjectID;
                if(itObjects == mSourceToTarget.end())
                {
                    targetObjectID = mObjectsContext->GetInDirectObjectsRegistry().AllocateNewObjectID();
                    mSourceToTarget.insert(ObjectIDTypeToObjectIDTypeMap::value_type(indirectReference->mObjectID,targetObjectID));
                    ioObjectsToLaterCopy.push_back(indirectReference->mObjectID);
                }
                else
                {
                    targetObjectID = itObjects->second;
                }
                ioMappedResourcesNames.insert(StringToStringMap::value_type(AsEncodedName(it.GetKey()->GetValue()),
                                                                            inCommand->RegisterInDirectResourceInFormResources(targetObjectID)));
            }
            else 
            {
                
                ResourceCopierTask* task = new ResourceCopierTask(inTargetFormXObject,this,it.GetValue());
                StringToStringMap::iterator itInsert = ioMappedResourcesNames.insert(StringToStringMap::value_type(AsEncodedName(it.GetKey()->GetValue()),
                                                                            mDocumentContext->AddExtendedResourceMapping(inTargetFormXObject, inCommand->GetResourcesCategoryName(),
                                                                                task))).first;
                task->SetResourceName(itInsert->second);
            }
        }
    }
}